

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O2

int Gia_ManFindFailedPoCex(Gia_Man_t *pAig,Abc_Cex_t *p,int nOutputs)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  char *__assertion;
  int v;
  int iVar9;
  
  if (pAig->vCis->nSize - pAig->nRegs == p->nPis) {
    Gia_ManCleanMark0(pAig);
    uVar8 = 0;
    while (((int)uVar8 < pAig->nRegs &&
           (pGVar4 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + uVar8),
           pGVar4 != (Gia_Obj_t *)0x0))) {
      uVar7 = uVar8 >> 5;
      bVar6 = (byte)uVar8;
      uVar8 = uVar8 + 1;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[uVar7] >> (bVar6 & 0x1f) & 1) << 0x1e);
    }
    iVar9 = p->nRegs;
    for (iVar3 = 0; iVar3 <= p->iFrame; iVar3 = iVar3 + 1) {
      v = 0;
      while ((iVar1 = v + iVar9, v < pAig->vCis->nSize - pAig->nRegs &&
             (pGVar4 = Gia_ManCi(pAig,v), pGVar4 != (Gia_Obj_t *)0x0))) {
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xffffffffbfffffff |
             (ulong)(((uint)(&p[1].iPo)[iVar1 >> 5] >> ((byte)iVar1 & 0x1f) & 1) << 0x1e);
        v = v + 1;
      }
      iVar9 = 0;
      while ((iVar9 < pAig->nObjs && (pGVar4 = Gia_ManObj(pAig,iVar9), pGVar4 != (Gia_Obj_t *)0x0)))
      {
        uVar2 = *(ulong *)pGVar4;
        if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar2) {
          uVar8 = (uint)(uVar2 >> 0x20);
          *(ulong *)pGVar4 =
               uVar2 & 0xffffffff3fffffff |
               (ulong)(((uVar8 >> 0x1d ^ *(uint *)(pGVar4 + -(ulong)(uVar8 & 0x1fffffff)) >> 0x1e) &
                        ((uint)(uVar2 >> 0x1d) & 7 ^
                        *(uint *)(pGVar4 + -(uVar2 & 0x1fffffff)) >> 0x1e) & 1) << 0x1e);
        }
        iVar9 = iVar9 + 1;
      }
      iVar9 = 0;
      while ((iVar9 < pAig->vCos->nSize &&
             (pGVar4 = Gia_ManCo(pAig,iVar9), pGVar4 != (Gia_Obj_t *)0x0))) {
        uVar8 = (uint)*(ulong *)pGVar4;
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xffffffffbfffffff |
             (ulong)((uVar8 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar8 & 0x1fffffff))) & 0x40000000);
        iVar9 = iVar9 + 1;
      }
      iVar9 = 0;
      while (((iVar9 < pAig->nRegs &&
              (pGVar4 = Gia_ManCo(pAig,(pAig->vCos->nSize - pAig->nRegs) + iVar9),
              pGVar4 != (Gia_Obj_t *)0x0)) &&
             (pGVar5 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar9),
             pGVar5 != (Gia_Obj_t *)0x0))) {
        *(ulong *)pGVar5 =
             *(ulong *)pGVar5 & 0xffffffffbfffffff |
             (ulong)((uint)*(undefined8 *)pGVar4 & 0x40000000);
        iVar9 = iVar9 + 1;
      }
      iVar9 = iVar1;
    }
    if (iVar9 == p->nBits) {
      while ((iVar9 = -1, nOutputs < pAig->vCos->nSize - pAig->nRegs &&
             (pGVar4 = Gia_ManPo(pAig,nOutputs), iVar9 = nOutputs, (pGVar4->field_0x3 & 0x40) == 0))
            ) {
        nOutputs = nOutputs + 1;
      }
      Gia_ManCleanMark0(pAig);
      return iVar9;
    }
    __assertion = "iBit == p->nBits";
    uVar8 = 0x70;
  }
  else {
    __assertion = "Gia_ManPiNum(pAig) == p->nPis";
    uVar8 = 0x5f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                ,uVar8,"int Gia_ManFindFailedPoCex(Gia_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

int Gia_ManFindFailedPoCex( Gia_Man_t * pAig, Abc_Cex_t * p, int nOutputs )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    assert( Gia_ManPiNum(pAig) == p->nPis );
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    // figure out the number of failed output
    RetValue = -1;
//    for ( i = Gia_ManPoNum(pAig) - 1; i >= nOutputs; i-- )
    for ( i = nOutputs; i < Gia_ManPoNum(pAig); i++ )
    {
        if ( Gia_ManPo(pAig, i)->fMark0 )
        {
            RetValue = i;
            break;
        }
    }
    Gia_ManCleanMark0(pAig);
    return RetValue;
}